

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O0

int32_t adt_hash_values(adt_hash_t *self,adt_ary_t *pArray)

{
  char *self_00;
  int32_t s32Len;
  void **ppvVar1;
  void **ppValue;
  char *pcStack_28;
  int32_t s32i;
  char *pKey;
  adt_ary_t *pArray_local;
  adt_hash_t *self_local;
  
  ppValue._4_4_ = 0;
  if ((self == (adt_hash_t *)0x0) || (pArray == (adt_ary_t *)0x0)) {
    self_local._4_4_ = 0;
  }
  else {
    pKey = (char *)pArray;
    pArray_local = (adt_ary_t *)self;
    adt_hash_iter_init(self);
    adt_ary_clear((adt_ary_t *)pKey);
    self_00 = pKey;
    s32Len = adt_hash_length((adt_hash_t *)pArray_local);
    adt_ary_extend((adt_ary_t *)self_00,s32Len);
    do {
      ppvVar1 = adt_hash_iter_next((adt_hash_t *)pArray_local,&stack0xffffffffffffffd8);
      if (ppvVar1 != (void **)0x0) {
        adt_ary_set((adt_ary_t *)pKey,ppValue._4_4_,*ppvVar1);
        ppValue._4_4_ = ppValue._4_4_ + 1;
      }
    } while (pcStack_28 != (char *)0x0);
    self_local._4_4_ = ppValue._4_4_;
  }
  return self_local._4_4_;
}

Assistant:

int32_t adt_hash_values(adt_hash_t *self, adt_ary_t* pArray)
{
   const char *pKey;
   int32_t s32i=0;

   if( (self==0) || (pArray==0)) return 0;
   adt_hash_iter_init(self);
   adt_ary_clear(pArray);
   adt_ary_extend(pArray,adt_hash_length(self));
   do{
      void **ppValue = adt_hash_iter_next(self,&pKey);
      if(ppValue != 0){
         adt_ary_set(pArray,s32i++, *ppValue);
      }
   } while(pKey);
   return s32i;
}